

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O2

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
pushBack<pica::Particle<(pica::Dimension)1>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *this,
          Particle<(pica::Dimension)1> particle)

{
  int d;
  long lVar1;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *this_00;
  double local_50;
  double local_48 [4];
  
  local_48[0] = particle.position.x;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)this,local_48);
  local_48[2] = particle.p.z;
  local_48[0] = particle.p.x;
  local_48[1] = particle.p.y;
  this_00 = this + 0x18;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    local_50 = local_48[lVar1];
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)this_00,&local_50);
    this_00 = this_00 + 0x18;
  }
  local_50 = particle.factor;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)(this + 0x60),&local_50);
  local_50 = 1.0 / (1.0 / particle.invGamma);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)(this + 0x78),&local_50);
  local_50 = (double)CONCAT62(local_50._2_6_,particle.typeIndex);
  std::vector<short,_std::allocator<short>_>::emplace_back<short>
            ((vector<short,_std::allocator<short>_> *)(this + 0x90),(short *)&local_50);
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }